

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O0

t_int * sigvcf_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  t_float *ptVar3;
  t_int tVar4;
  float *pfVar5;
  uint uVar6;
  int iVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  float local_b8;
  float local_b4;
  float local_ac;
  float oneminusr;
  float r;
  float cfindx;
  float cf;
  tabfudge tf;
  int tabindex;
  int normhipart;
  double dphase;
  float frac;
  float f2;
  float f1;
  float *addr;
  float *tab;
  t_float coefi;
  t_float coefr;
  t_float ampcorrect;
  t_float qinv;
  t_float isr;
  t_float q;
  t_float im;
  t_float re2;
  t_float re;
  int i;
  int n;
  t_vcfctl *c;
  t_sample *out2;
  t_sample *out1;
  t_sample *in2;
  t_sample *in1;
  t_int *w_local;
  
  pfVar5 = cos_table;
  ptVar3 = (t_float *)w[5];
  tVar4 = w[6];
  isr = ptVar3[1];
  fVar1 = ptVar3[2];
  fVar2 = ptVar3[3];
  if (fVar1 <= 0.0) {
    local_b4 = 0.0;
  }
  else {
    local_b4 = 1.0 / fVar1;
  }
  im = *ptVar3;
  c = (t_vcfctl *)w[4];
  out2 = (t_sample *)w[3];
  out1 = (t_sample *)w[2];
  in2 = (t_sample *)w[1];
  for (re2 = 0.0; (int)re2 < (int)tVar4; re2 = (t_float)((int)re2 + 1)) {
    r = *out1 * fVar2;
    if (r < 0.0) {
      r = 0.0;
    }
    if (local_b4 <= 0.0) {
      local_b8 = 0.0;
    }
    else {
      local_b8 = -r * local_b4 + 1.0;
    }
    local_ac = local_b8;
    if (local_b8 < 0.0) {
      local_ac = 0.0;
    }
    dVar12 = (double)(r * 81.4874) + 1572864.0;
    cf = (float)((ulong)dVar12 >> 0x20);
    uVar6 = (uint)cf & 0x1ff;
    pfVar8 = pfVar5 + (int)uVar6;
    _cfindx = (double)CONCAT44(0x41380000,SUB84(dVar12,0));
    fVar10 = *pfVar8;
    fVar9 = local_ac * ((float)(_cfindx - 1572864.0) * (pfVar8[1] - fVar10) + fVar10);
    pfVar8 = pfVar5 + (int)(uVar6 - 0x80 & 0x1ff);
    fVar10 = *pfVar8;
    fVar10 = local_ac * ((float)(_cfindx - 1572864.0) * (pfVar8[1] - fVar10) + fVar10);
    fVar11 = -fVar10 * isr + (2.0 - 2.0 / (fVar1 + 2.0)) * (1.0 - local_ac) * *in2 + fVar9 * im;
    *out2 = fVar11;
    isr = fVar10 * im + fVar9 * isr;
    c->c_re = isr;
    im = fVar11;
    c = (t_vcfctl *)&c->c_im;
    out2 = out2 + 1;
    out1 = out1 + 1;
    in2 = in2 + 1;
  }
  iVar7 = PD_BIGORSMALL(im);
  if (iVar7 != 0) {
    im = 0.0;
  }
  iVar7 = PD_BIGORSMALL(isr);
  if (iVar7 != 0) {
    isr = 0.0;
  }
  *ptVar3 = im;
  ptVar3[1] = isr;
  return w + 7;
}

Assistant:

static t_int *sigvcf_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out1 = (t_sample *)(w[3]);
    t_sample *out2 = (t_sample *)(w[4]);
    t_vcfctl *c = (t_vcfctl *)(w[5]);
    int n = (int)w[6];
    int i;
    t_float re = c->c_re, re2;
    t_float im = c->c_im;
    t_float q = c->c_q;
    t_float isr = c->c_isr;
    t_float qinv = (q > 0? 1.0f/q : 0);
    t_float ampcorrect = 2. - 2. / (q + 2.);
    t_float coefr, coefi;
    float *tab = cos_table, *addr, f1, f2, frac;
    double dphase;
    int normhipart, tabindex;
    union tabfudge tf;

    tf.tf_d = UNITBIT32;
    normhipart = tf.tf_i[HIOFFSET];

    for (i = 0; i < n; i++)
    {
        float cf, cfindx, r, oneminusr;
        cf = *in2++ * isr;
        if (cf < 0) cf = 0;
        cfindx = cf * (float)(COSTABSIZE/6.28318f);
        r = (qinv > 0 ? 1 - cf * qinv : 0);
        if (r < 0) r = 0;
        oneminusr = 1.0f - r;
        dphase = ((double)(cfindx)) + UNITBIT32;
        tf.tf_d = dphase;
        tabindex = tf.tf_i[HIOFFSET] & (COSTABSIZE-1);
        addr = tab + tabindex;
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
        f1 = addr[0];
        f2 = addr[1];
        coefr = r * (f1 + frac * (f2 - f1));

        addr = tab + ((tabindex - (COSTABSIZE/4)) & (COSTABSIZE-1));
        f1 = addr[0];
        f2 = addr[1];
        coefi = r * (f1 + frac * (f2 - f1));

        f1 = *in1++;
        re2 = re;
        *out1++ = re = ampcorrect * oneminusr * f1
            + coefr * re2 - coefi * im;
        *out2++ = im = coefi * re2 + coefr * im;
    }
    if (PD_BIGORSMALL(re))
        re = 0;
    if (PD_BIGORSMALL(im))
        im = 0;
    c->c_re = re;
    c->c_im = im;
    return (w+7);
}